

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.h
# Opt level: O3

void __thiscall QPainter::drawImage(QPainter *this,QRect *r,QImage *image)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined8 local_68;
  undefined8 uStack_60;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  double local_38;
  double local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = r->x1;
  uVar2 = r->y1;
  local_48._8_4_ = SUB84((double)(int)uVar2,0);
  local_48._0_8_ = (double)(int)uVar1;
  local_48._12_4_ = (int)((ulong)(double)(int)uVar2 >> 0x20);
  local_38 = (double)(((long)(r->x2).m_i - (long)(int)uVar1) + 1);
  local_30 = (double)(((long)(r->y2).m_i - (long)(int)uVar2) + 1);
  iVar3 = QImage::width();
  iVar4 = QImage::height();
  local_50 = (double)iVar4;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = (double)iVar3;
  QPainter::drawImage(this,local_48,image,&local_68,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QPainter::drawImage(const QRect &r, const QImage &image)
{
    drawImage(r, image, QRectF(0, 0, image.width(), image.height()));
}